

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O3

int lj_cf_jit_util_traceir(lua_State *L)

{
  byte bVar1;
  long lVar2;
  TValue *pTVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  
  uVar4 = lj_lib_checkint(L,1);
  if ((uVar4 == 0) || (uVar5 = (ulong)(L->glref).ptr32, *(uint *)(uVar5 + 0x3c4) <= uVar4)) {
    uVar5 = 0;
  }
  else {
    uVar5 = (ulong)*(uint *)(*(long *)(uVar5 + 0x3b8) + (ulong)uVar4 * 4);
  }
  uVar4 = lj_lib_checkint(L,2);
  iVar6 = 0;
  if ((uVar5 != 0 && uVar4 < 0xffff8000) && (iVar6 = 0, uVar4 + 0x8000 < *(uint *)(uVar5 + 8))) {
    lVar2 = *(long *)(uVar5 + 0x10);
    uVar5 = (ulong)(uVar4 + 0x8000);
    bVar1 = lj_ir_mode[*(byte *)(lVar2 + 5 + uVar5 * 8)];
    L->top[-2].n = (double)bVar1;
    L->top[-1].n = (double)*(ushort *)(lVar2 + 4 + uVar5 * 8);
    pTVar3 = L->top;
    L->top = pTVar3 + 1;
    pTVar3->n = (double)(int)((*(ushort *)(lVar2 + uVar5 * 8) - 0x8000) +
                             (uint)((bVar1 & 3) != 0) * 0x8000);
    pTVar3 = L->top;
    L->top = pTVar3 + 1;
    pTVar3->n = (double)(int)((*(ushort *)(lVar2 + 2 + uVar5 * 8) - 0x8000) +
                             (uint)((bVar1 & 0xc) != 0) * 0x8000);
    pTVar3 = L->top;
    L->top = pTVar3 + 1;
    pTVar3->n = (double)*(ushort *)(lVar2 + 6 + uVar5 * 8);
    iVar6 = 5;
  }
  return iVar6;
}

Assistant:

LJLIB_CF(jit_util_traceir)
{
  GCtrace *T = jit_checktrace(L);
  IRRef ref = (IRRef)lj_lib_checkint(L, 2) + REF_BIAS;
  if (T && ref >= REF_BIAS && ref < T->nins) {
    IRIns *ir = &T->ir[ref];
    int32_t m = lj_ir_mode[ir->o];
    setintV(L->top-2, m);
    setintV(L->top-1, ir->ot);
    setintV(L->top++, (int32_t)ir->op1 - (irm_op1(m)==IRMref ? REF_BIAS : 0));
    setintV(L->top++, (int32_t)ir->op2 - (irm_op2(m)==IRMref ? REF_BIAS : 0));
    setintV(L->top++, ir->prev);
    return 5;
  }
  return 0;
}